

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_32f82::BoidsPlugIn::handleFunctionKeys(BoidsPlugIn *this,int keyNumber)

{
  ProximityToken *pPVar1;
  long lVar2;
  ostream *poVar3;
  int max;
  int min;
  float local_3c;
  int local_38;
  int local_34;
  
  switch(keyNumber) {
  case 1:
    addBoidToFlock(this);
    return;
  case 2:
    removeBoidFromFlock(this);
    return;
  case 3:
    nextPD(this);
    return;
  case 4:
    this->constraint = this->constraint + insideSphere;
    updateObstacles(this);
    return;
  case 5:
    pPVar1 = (*(this->flock).
               super__Vector_base<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->proximityToken;
    (*pPVar1->_vptr_AbstractTokenForProximityDatabase[4])(pPVar1,&local_34,&local_38,&local_3c);
    lVar2 = std::cout;
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 2;
    *(uint *)(XSetLocaleModifiers + *(long *)(lVar2 + -0x18)) =
         *(uint *)(XSetLocaleModifiers + *(long *)(lVar2 + -0x18)) | 4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Bin populations: min, max, average: ",0x24);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>((double)local_3c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (non-empty bins)",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Boid neighbors:  min, max, average: ",0x24);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<double>
                       ((double)((float)(anonymous_namespace)::Boid::totalNeighbors /
                                (float)this->population));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void handleFunctionKeys (int keyNumber)
        {
            switch (keyNumber)
            {
            case 1:  addBoidToFlock ();         break;
            case 2:  removeBoidFromFlock ();    break;
            case 3:  nextPD ();                 break;
            case 4:  nextBoundaryCondition ();  break;
            case 5:  printLQbinStats ();        break;
            }
        }